

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int r1fgkf_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  int ipph;
  int idij;
  int ipp2;
  int idp2;
  double ar2h;
  double ar1h;
  double tpi;
  double dsp;
  double arg;
  double dcp;
  int nbd;
  double ds2;
  double ar2;
  double ar1;
  double ai2;
  double ai1;
  double dc2;
  int is;
  int ik;
  int lc;
  int jc;
  int ic;
  int j2;
  int l;
  int k;
  int j;
  int i__;
  int i__3;
  int i__2;
  int i__1;
  int ch2_offset;
  int ch2_dim2;
  int ch2_dim1;
  int c2_offset;
  int c2_dim2;
  int c2_dim1;
  int c1_offset;
  int c1_dim3;
  int c1_dim2;
  int c1_dim1;
  int cc_offset;
  int cc_dim3;
  int cc_dim2;
  int cc_dim1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int ch_dim1;
  undefined4 local_12c;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  
  lVar22 = (long)dsp + -8;
  iVar1 = *_ipp2;
  iVar2 = *in_RCX;
  lVar23 = _ipph + (long)(iVar1 * (iVar2 + 1) + 1) * -8;
  iVar20 = *_ipp2;
  iVar3 = *in_RDI;
  iVar21 = *in_RDX;
  lVar24 = in_R9 + (long)(iVar20 * (iVar3 * (iVar21 + 1) + 1) + 1) * -8;
  iVar4 = *_ipp2;
  iVar5 = *in_RDI;
  iVar6 = *in_RSI;
  lVar25 = in_R8 + (long)(iVar4 * (iVar5 * (iVar6 + 1) + 1) + 1) * -8;
  iVar7 = *(int *)tpi;
  iVar8 = *in_RCX;
  lVar26 = (long)ar1h + (long)(iVar7 * (iVar8 + 1) + 1) * -8;
  iVar9 = *(int *)tpi;
  iVar10 = *in_RDI;
  iVar11 = *in_RDX;
  lVar27 = (long)ar2h + (long)(iVar9 * (iVar10 * (iVar11 + 1) + 1) + 1) * -8;
  dVar28 = atan(1.0);
  dVar28 = (dVar28 * 8.0) / (double)*in_RSI;
  dVar29 = cos(dVar28);
  dVar28 = sin(dVar28);
  iVar15 = (*in_RSI + 1) / 2;
  iVar16 = *in_RSI + 2;
  iVar12 = *in_RDI;
  iVar17 = (*in_RDI + -1) / 2;
  if (*in_RDI == 1) {
    iVar14 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar14; local_b0 = local_b0 + 1) {
      *(undefined8 *)(lVar23 + (long)((local_b0 + iVar2) * iVar1 + 1) * 8) =
           *(undefined8 *)(lVar26 + (long)((local_b0 + iVar8) * iVar7 + 1) * 8);
    }
  }
  else {
    iVar14 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar14; local_b0 = local_b0 + 1) {
      *(undefined8 *)(lVar26 + (long)((local_b0 + iVar8) * iVar7 + 1) * 8) =
           *(undefined8 *)(lVar23 + (long)((local_b0 + iVar2) * iVar1 + 1) * 8);
    }
    iVar14 = *in_RSI;
    for (local_94 = 2; local_94 <= iVar14; local_94 = local_94 + 1) {
      iVar19 = *in_RDX;
      for (local_98 = 1; local_98 <= iVar19; local_98 = local_98 + 1) {
        *(undefined8 *)
         (lVar27 + (long)(((local_98 + local_94 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8) =
             *(undefined8 *)
              (lVar24 + (long)(((local_98 + local_94 * iVar21) * iVar3 + 1) * iVar20 + 1) * 8);
      }
    }
    if (*in_RDX < iVar17) {
      local_b4 = -*in_RDI;
      iVar14 = *in_RSI;
      for (local_94 = 2; local_94 <= iVar14; local_94 = local_94 + 1) {
        local_b4 = *in_RDI + local_b4;
        iVar19 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar19; local_98 = local_98 + 1) {
          iVar13 = *in_RDI;
          local_12c = local_b4;
          for (local_90 = 3; local_90 <= iVar13; local_90 = local_90 + 2) {
            iVar18 = local_12c + 2;
            *(double *)
             (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                       * 8) =
                 *(double *)(lVar22 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) * iVar20
                                  + 1) * 8) +
                 *(double *)(lVar22 + (long)iVar18 * 8) *
                 *(double *)
                  (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1)
                            * 8);
            *(double *)
             (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1) * 8)
                 = *(double *)(lVar22 + (long)(local_12c + 1) * 8) *
                   *(double *)
                    (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 +
                                    1) * 8) +
                   -(*(double *)(lVar22 + (long)iVar18 * 8) *
                    *(double *)
                     (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) *
                                      iVar20 + 1) * 8));
            local_12c = iVar18;
          }
        }
      }
    }
    else {
      local_b4 = -*in_RDI;
      iVar14 = *in_RSI;
      for (local_94 = 2; local_94 <= iVar14; local_94 = local_94 + 1) {
        local_b4 = *in_RDI + local_b4;
        iVar19 = *in_RDI;
        local_12c = local_b4;
        for (local_90 = 3; local_90 <= iVar19; local_90 = local_90 + 2) {
          iVar18 = local_12c + 2;
          iVar13 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar13; local_98 = local_98 + 1) {
            *(double *)
             (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                       * 8) =
                 *(double *)(lVar22 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) * iVar20
                                  + 1) * 8) +
                 *(double *)(lVar22 + (long)iVar18 * 8) *
                 *(double *)
                  (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1)
                            * 8);
            *(double *)
             (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1) * 8)
                 = *(double *)(lVar22 + (long)(local_12c + 1) * 8) *
                   *(double *)
                    (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 +
                                    1) * 8) +
                   -(*(double *)(lVar22 + (long)iVar18 * 8) *
                    *(double *)
                     (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) *
                                      iVar20 + 1) * 8));
          }
          local_12c = iVar18;
        }
      }
    }
    if (iVar17 < *in_RDX) {
      for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
        iVar19 = iVar16 - local_94;
        iVar14 = *in_RDI;
        for (local_90 = 3; local_90 <= iVar14; local_90 = local_90 + 2) {
          iVar13 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar13; local_98 = local_98 + 1) {
            *(double *)
             (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1)
                       * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) +
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar24 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar21) * iVar3) * iVar20 + 1) *
                       8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                            * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 + 1) *
                            8);
            *(double *)
             (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1) * 8)
                 = *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 +
                                    1) * 8) +
                   *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 + 1)
                              * 8);
            *(double *)
             (lVar24 + (long)((local_90 + (local_98 + iVar19 * iVar21) * iVar3) * iVar20 + 1) * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 +
                                  1) * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8);
          }
        }
      }
    }
    else {
      for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
        iVar19 = iVar16 - local_94;
        iVar14 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar14; local_98 = local_98 + 1) {
          iVar13 = *in_RDI;
          for (local_90 = 3; local_90 <= iVar13; local_90 = local_90 + 2) {
            *(double *)
             (lVar24 + (long)((local_90 + -1 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1)
                       * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) +
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar24 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar21) * iVar3) * iVar20 + 1) *
                       8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                            * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 + 1) *
                            8);
            *(double *)
             (lVar24 + (long)((local_90 + (local_98 + local_94 * iVar21) * iVar3) * iVar20 + 1) * 8)
                 = *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 +
                                    1) * 8) +
                   *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 + 1)
                              * 8);
            *(double *)
             (lVar24 + (long)((local_90 + (local_98 + iVar19 * iVar21) * iVar3) * iVar20 + 1) * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar19 * iVar11) * iVar10) * iVar9 +
                                  1) * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8);
          }
        }
      }
    }
  }
  for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
    iVar19 = iVar16 - local_94;
    iVar14 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar14; local_98 = local_98 + 1) {
      *(double *)(lVar24 + (long)(((local_98 + local_94 * iVar21) * iVar3 + 1) * iVar20 + 1) * 8) =
           *(double *)
            (lVar27 + (long)(((local_98 + local_94 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8) +
           *(double *)(lVar27 + (long)(((local_98 + iVar19 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8)
      ;
      *(double *)(lVar24 + (long)(((local_98 + iVar19 * iVar21) * iVar3 + 1) * iVar20 + 1) * 8) =
           *(double *)(lVar27 + (long)(((local_98 + iVar19 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8)
           - *(double *)
              (lVar27 + (long)(((local_98 + local_94 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8);
    }
  }
  local_d8 = 1.0;
  local_c8 = 0.0;
  for (local_9c = 2; local_9c <= iVar15; local_9c = local_9c + 1) {
    dVar30 = dVar29 * local_d8 + -(dVar28 * local_c8);
    local_c8 = dVar29 * local_c8 + dVar28 * local_d8;
    iVar20 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar20; local_b0 = local_b0 + 1) {
      *(double *)(lVar26 + (long)((local_b0 + local_9c * iVar8) * iVar7 + 1) * 8) =
           dVar30 * *(double *)(lVar23 + (long)((local_b0 + iVar2 * 2) * iVar1 + 1) * 8) +
           *(double *)(lVar23 + (long)((local_b0 + iVar2) * iVar1 + 1) * 8);
      *(double *)(lVar26 + (long)((local_b0 + (iVar16 - local_9c) * iVar8) * iVar7 + 1) * 8) =
           local_c8 * *(double *)(lVar23 + (long)((local_b0 + *in_RSI * iVar2) * iVar1 + 1) * 8);
    }
    local_e0 = dVar30;
    local_d0 = local_c8;
    for (local_94 = 3; local_94 <= iVar15; local_94 = local_94 + 1) {
      dVar31 = dVar30 * local_e0 + -(local_c8 * local_d0);
      local_d0 = dVar30 * local_d0 + local_c8 * local_e0;
      iVar20 = *in_RCX;
      for (local_b0 = 1; local_b0 <= iVar20; local_b0 = local_b0 + 1) {
        lVar22 = (long)((local_b0 + local_9c * iVar8) * iVar7 + 1);
        *(double *)(lVar26 + lVar22 * 8) =
             dVar31 * *(double *)(lVar23 + (long)((local_b0 + local_94 * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar26 + lVar22 * 8);
        lVar22 = (long)((local_b0 + (iVar16 - local_9c) * iVar8) * iVar7 + 1);
        *(double *)(lVar26 + lVar22 * 8) =
             local_d0 *
             *(double *)(lVar23 + (long)((local_b0 + (iVar16 - local_94) * iVar2) * iVar1 + 1) * 8)
             + *(double *)(lVar26 + lVar22 * 8);
      }
      local_e0 = dVar31;
    }
    local_d8 = dVar30;
  }
  for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
    iVar20 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar20; local_b0 = local_b0 + 1) {
      lVar22 = (long)((local_b0 + iVar8) * iVar7 + 1);
      *(double *)(lVar26 + lVar22 * 8) =
           *(double *)(lVar23 + (long)((local_b0 + local_94 * iVar2) * iVar1 + 1) * 8) +
           *(double *)(lVar26 + lVar22 * 8);
    }
  }
  if (*in_RDI < *in_RDX) {
    iVar1 = *in_RDI;
    for (local_90 = 1; local_90 <= iVar1; local_90 = local_90 + 1) {
      iVar2 = *in_RDX;
      for (local_98 = 1; local_98 <= iVar2; local_98 = local_98 + 1) {
        *(undefined8 *)
         (lVar25 + (long)((local_90 + (local_98 * iVar6 + 1) * iVar5) * iVar4 + 1) * 8) =
             *(undefined8 *)
              (lVar27 + (long)((local_90 + (local_98 + iVar11) * iVar10) * iVar9 + 1) * 8);
      }
    }
  }
  else {
    iVar1 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar1; local_98 = local_98 + 1) {
      iVar2 = *in_RDI;
      for (local_90 = 1; local_90 <= iVar2; local_90 = local_90 + 1) {
        *(undefined8 *)
         (lVar25 + (long)((local_90 + (local_98 * iVar6 + 1) * iVar5) * iVar4 + 1) * 8) =
             *(undefined8 *)
              (lVar27 + (long)((local_90 + (local_98 + iVar11) * iVar10) * iVar9 + 1) * 8);
      }
    }
  }
  for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
    iVar1 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar1; local_98 = local_98 + 1) {
      *(undefined8 *)
       (lVar25 + (long)((*in_RDI + (local_94 * 2 + -2 + local_98 * iVar6) * iVar5) * iVar4 + 1) * 8)
           = *(undefined8 *)
              (lVar27 + (long)(((local_98 + local_94 * iVar11) * iVar10 + 1) * iVar9 + 1) * 8);
      *(undefined8 *)
       (lVar25 + (long)(((local_94 * 2 + -1 + local_98 * iVar6) * iVar5 + 1) * iVar4 + 1) * 8) =
           *(undefined8 *)
            (lVar27 + (long)(((local_98 + (iVar16 - local_94) * iVar11) * iVar10 + 1) * iVar9 + 1) *
                      8);
    }
  }
  if (*in_RDI != 1) {
    if (iVar17 < *in_RDX) {
      for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
        iVar20 = iVar16 - local_94;
        iVar2 = local_94 * 2;
        iVar1 = *in_RDI;
        for (local_90 = 3; local_90 <= iVar1; local_90 = local_90 + 2) {
          iVar21 = (iVar12 + 2) - local_90;
          iVar3 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar3; local_98 = local_98 + 1) {
            *(double *)
             (lVar25 + (long)((local_90 + -1 + (iVar2 + -1 + local_98 * iVar6) * iVar5) * iVar4 + 1)
                       * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) +
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar25 + (long)((iVar21 + -1 + (iVar2 + -2 + local_98 * iVar6) * iVar5) * iVar4 + 1) *
                       8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar25 + (long)((local_90 + (iVar2 + -1 + local_98 * iVar6) * iVar5) * iVar4 + 1) * 8)
                 = *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 +
                                    1) * 8) +
                   *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 + 1)
                              * 8);
            *(double *)
             (lVar25 + (long)((iVar21 + (iVar2 + -2 + local_98 * iVar6) * iVar5) * iVar4 + 1) * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 + 1) *
                            8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                            * 8);
          }
        }
      }
    }
    else {
      for (local_94 = 2; local_94 <= iVar15; local_94 = local_94 + 1) {
        iVar20 = iVar16 - local_94;
        iVar2 = local_94 * 2;
        iVar1 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar1; local_98 = local_98 + 1) {
          iVar3 = *in_RDI;
          for (local_90 = 3; local_90 <= iVar3; local_90 = local_90 + 2) {
            iVar21 = (iVar12 + 2) - local_90;
            *(double *)
             (lVar25 + (long)((local_90 + -1 + (iVar2 + -1 + local_98 * iVar6) * iVar5) * iVar4 + 1)
                       * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) +
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar25 + (long)((iVar21 + -1 + (iVar2 + -2 + local_98 * iVar6) * iVar5) * iVar4 + 1) *
                       8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + local_94 * iVar11) * iVar10) * iVar9
                                  + 1) * 8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 +
                                  1) * 8);
            *(double *)
             (lVar25 + (long)((local_90 + (iVar2 + -1 + local_98 * iVar6) * iVar5) * iVar4 + 1) * 8)
                 = *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 +
                                    1) * 8) +
                   *(double *)
                    (lVar27 + (long)((local_90 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 + 1)
                              * 8);
            *(double *)
             (lVar25 + (long)((iVar21 + (iVar2 + -2 + local_98 * iVar6) * iVar5) * iVar4 + 1) * 8) =
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + iVar20 * iVar11) * iVar10) * iVar9 + 1) *
                            8) -
                 *(double *)
                  (lVar27 + (long)((local_90 + (local_98 + local_94 * iVar11) * iVar10) * iVar9 + 1)
                            * 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int r1fgkf_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    ipph = (*ip + 1) / 2;
    ipp2 = *ip + 2;
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    if (*ido == 1) {
	goto L119;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	ch2[(ik + ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) * c2_dim1 + 1]
		;
/* L101: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L102: */
	}
/* L103: */
    }
    if (nbd > *l1) {
	goto L107;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L104: */
	    }
/* L105: */
	}
/* L106: */
    }
    goto L111;
L107:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L108: */
	    }
/* L109: */
	}
/* L110: */
    }
L111:
    if (nbd < *l1) {
	goto L115;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L112: */
	    }
/* L113: */
	}
/* L114: */
    }
    goto L121;
L115:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L116: */
	    }
/* L117: */
	}
/* L118: */
    }
    goto L121;
L119:
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L120: */
    }
L121:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] + ch[((k + jc *
		    ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    c1[((k + jc * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k +
		    jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] - ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L122: */
	}
/* L123: */
    }

    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) *
		    c2_dim1 + 1] + ar1 * c2[(ik + (c2_dim2 << 1)) * c2_dim1 +
		    1];
	    ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] = ai1 * c2[(ik + *ip *
		    c2_dim2) * c2_dim1 + 1];
/* L124: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] += ar2 * c2[(ik + j *
			c2_dim2) * c2_dim1 + 1];
		ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] += ai2 * c2[(ik + jc
			* c2_dim2) * c2_dim1 + 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += c2[(ik + j * c2_dim2) *
		    c2_dim1 + 1];
/* L128: */
	}
/* L129: */
    }

    if (*ido < *l1) {
	goto L132;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L130: */
	}
/* L131: */
    }
    goto L135;
L132:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L133: */
	}
/* L134: */
    }
L135:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(*ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(
		    (k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    cc[((j2 - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] = ch[((k
		    + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L136: */
	}
/* L137: */
    }
    if (*ido == 1) {
	return 0;
    }
    if (nbd < *l1) {
	goto L141;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L138: */
	    }
/* L139: */
	}
/* L140: */
    }
    return 0;
L141:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L142: */
	    }
/* L143: */
	}
/* L144: */
    }
    return 0;
}